

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenStorage.cpp
# Opt level: O0

TCHAR * CheckForIndexDirectory(TCascStorage *hs,TCHAR *szSubDir)

{
  bool bVar1;
  TCHAR *local_20;
  TCHAR *szIndexPath;
  TCHAR *szSubDir_local;
  TCascStorage *hs_local;
  
  local_20 = CombinePath(hs->szDataPath,szSubDir);
  bVar1 = DirectoryExists(local_20);
  if (!bVar1) {
    free(local_20);
    local_20 = (TCHAR *)0x0;
  }
  return local_20;
}

Assistant:

static TCHAR * CheckForIndexDirectory(TCascStorage * hs, const TCHAR * szSubDir)
{
    TCHAR * szIndexPath;

    // Combine the index path
    szIndexPath = CombinePath(hs->szDataPath, szSubDir);
    if (!DirectoryExists(szIndexPath))
    {
        CASC_FREE(szIndexPath);
        szIndexPath = NULL;
    }

    return szIndexPath;
}